

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::RegisterTestSuite
          (TypeParameterizedTestSuiteRegistry *this,char *test_suite_name,
          CodeLocation *code_location)

{
  CodeLocation local_b0;
  TypeParameterizedTestSuiteInfo local_88;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  CodeLocation *local_20;
  CodeLocation *code_location_local;
  char *test_suite_name_local;
  TypeParameterizedTestSuiteRegistry *this_local;
  
  local_20 = code_location;
  code_location_local = (CodeLocation *)test_suite_name;
  test_suite_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,test_suite_name,&local_41);
  CodeLocation::CodeLocation(&local_b0,code_location);
  TypeParameterizedTestSuiteInfo::TypeParameterizedTestSuiteInfo(&local_88,&local_b0);
  std::
  map<std::__cxx11::string,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>>
  ::
  emplace<std::__cxx11::string,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
            ((map<std::__cxx11::string,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>>>
              *)this,&local_40,&local_88);
  TypeParameterizedTestSuiteInfo::~TypeParameterizedTestSuiteInfo(&local_88);
  CodeLocation::~CodeLocation(&local_b0);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::RegisterTestSuite(
    const char* test_suite_name, CodeLocation code_location) {
  suites_.emplace(std::string(test_suite_name),
                  TypeParameterizedTestSuiteInfo(code_location));
}